

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void P_CreateSecNodeList(AActor *thing)

{
  double dVar1;
  sector_t *s;
  int iVar2;
  line_t *ld;
  msecnode_t *pmVar3;
  FBoundingBox box;
  FBlockLinesIterator it;
  FBoundingBox local_70;
  FBlockLinesIterator local_50;
  
  for (pmVar3 = sector_list; pmVar3 != (msecnode_t *)0x0; pmVar3 = pmVar3->m_tnext) {
    pmVar3->m_thing = (AActor *)0x0;
  }
  local_70.m_Box[3] = (thing->__Pos).X;
  local_70.m_Box[1] = (thing->__Pos).Y;
  dVar1 = thing->radius;
  local_70.m_Box[0] = local_70.m_Box[1] + dVar1;
  local_70.m_Box[2] = local_70.m_Box[3] - dVar1;
  local_70.m_Box[3] = local_70.m_Box[3] + dVar1;
  local_70.m_Box[1] = local_70.m_Box[1] - dVar1;
  FBlockLinesIterator::FBlockLinesIterator(&local_50,&local_70);
  ld = FBlockLinesIterator::Next(&local_50);
  if (ld != (line_t *)0x0) {
    do {
      if ((((local_70.m_Box[2] < ld->bbox[3]) &&
           (ld->bbox[2] <= local_70.m_Box[3] && local_70.m_Box[3] != ld->bbox[2])) &&
          (ld->bbox[1] <= local_70.m_Box[0] && local_70.m_Box[0] != ld->bbox[1])) &&
         (local_70.m_Box[1] < ld->bbox[0])) {
        iVar2 = FBoundingBox::BoxOnLineSide(&local_70,ld);
        if (iVar2 == -1) {
          sector_list = P_AddSecnode(ld->frontsector,thing,sector_list,
                                     &ld->frontsector->touching_thinglist);
          s = ld->backsector;
          if (s != (sector_t *)0x0) {
            sector_list = P_AddSecnode(s,thing,sector_list,&s->touching_thinglist);
          }
        }
      }
      ld = FBlockLinesIterator::Next(&local_50);
    } while (ld != (line_t *)0x0);
  }
  pmVar3 = P_AddSecnode(thing->Sector,thing,sector_list,&thing->Sector->touching_thinglist);
  sector_list = pmVar3;
  while (pmVar3 != (msecnode_t *)0x0) {
    if (pmVar3->m_thing == (AActor *)0x0) {
      if (pmVar3 == sector_list) {
        sector_list = pmVar3->m_tnext;
      }
      pmVar3 = P_DelSecnode(pmVar3,0x1b8);
    }
    else {
      pmVar3 = pmVar3->m_tnext;
    }
  }
  return;
}

Assistant:

void P_CreateSecNodeList(AActor *thing)
{
	msecnode_t *node;

	// First, clear out the existing m_thing fields. As each node is
	// added or verified as needed, m_thing will be set properly. When
	// finished, delete all nodes where m_thing is still NULL. These
	// represent the sectors the Thing has vacated.

	node = sector_list;
	while (node)
	{
		node->m_thing = NULL;
		node = node->m_tnext;
	}

	FBoundingBox box(thing->X(), thing->Y(), thing->radius);
	FBlockLinesIterator it(box);
	line_t *ld;

	while ((ld = it.Next()))
	{
		if (!box.inRange(ld) || box.BoxOnLineSide(ld) != -1)
			continue;

		// This line crosses through the object.

		// Collect the sector(s) from the line and add to the
		// sector_list you're examining. If the Thing ends up being
		// allowed to move to this position, then the sector_list
		// will be attached to the Thing's AActor at touching_sectorlist.

		sector_list = P_AddSecnode(ld->frontsector, thing, sector_list, ld->frontsector->touching_thinglist);

		// Don't assume all lines are 2-sided, since some Things
		// like MT_TFOG are allowed regardless of whether their radius takes
		// them beyond an impassable linedef.

		// killough 3/27/98, 4/4/98:
		// Use sidedefs instead of 2s flag to determine two-sidedness.

		if (ld->backsector)
			sector_list = P_AddSecnode(ld->backsector, thing, sector_list, ld->backsector->touching_thinglist);
	}

	// Add the sector of the (x,y) point to sector_list.

	sector_list = P_AddSecnode(thing->Sector, thing, sector_list, thing->Sector->touching_thinglist);

	// Now delete any nodes that won't be used. These are the ones where
	// m_thing is still NULL.

	node = sector_list;
	while (node)
	{
		if (node->m_thing == NULL)
		{
			if (node == sector_list)
				sector_list = node->m_tnext;
			node = P_DelSecnode(node, &sector_t::touching_thinglist);
		}
		else
		{
			node = node->m_tnext;
		}
	}
}